

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void duckdb::ApproxTopKFinalize<duckdb::HistogramStringFunctor>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  pointer prVar2;
  pointer prVar3;
  data_ptr_t pdVar4;
  ApproxTopKValue *pAVar5;
  Vector *result_00;
  InternalApproxTopKState *pIVar6;
  Vector *pVVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t i;
  ulong uVar10;
  long lVar11;
  idx_t offset_00;
  idx_t val_idx;
  string_t value;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  offset_00 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  result_00 = (Vector *)ListVector::GetListSize(result);
  lVar11 = 0;
  for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
    uVar8 = uVar10;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar8 = (ulong)(local_78.sel)->sel_vector[uVar10];
    }
    pIVar6 = ApproxTopKState::GetState(*(ApproxTopKState **)(local_78.data + uVar8 * 8));
    prVar2 = (pIVar6->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar3 = (pIVar6->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar2 != prVar3) {
      uVar8 = (long)prVar3 - (long)prVar2 >> 3;
      if (pIVar6->k <= uVar8) {
        uVar8 = pIVar6->k;
      }
      lVar11 = lVar11 + uVar8;
    }
  }
  ListVector::Reserve(result,(idx_t)(&result_00->vector_type + lVar11));
  pdVar4 = result->data;
  pVVar7 = ListVector::GetEntry(result);
  for (uVar10 = 0; uVar10 != count; uVar10 = uVar10 + 1) {
    uVar8 = uVar10;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar8 = (ulong)(local_78.sel)->sel_vector[uVar10];
    }
    pIVar6 = ApproxTopKState::GetState(*(ApproxTopKState **)(local_78.data + uVar8 * 8));
    if ((pIVar6->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pIVar6->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10 + offset);
    }
    else {
      lVar11 = (uVar10 + offset) * 0x10;
      plVar1 = (long *)(pdVar4 + lVar11);
      *(Vector **)(pdVar4 + lVar11) = result_00;
      uVar8 = 0;
      while( true ) {
        prVar2 = (pIVar6->values).
                 super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)(pIVar6->values).
                      super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)prVar2 >> 3;
        if (pIVar6->k <= uVar9) {
          uVar9 = pIVar6->k;
        }
        if (uVar9 <= uVar8) break;
        pAVar5 = prVar2[uVar8]._M_data;
        value.value.pointer.ptr = (char *)pVVar7;
        value.value._0_8_ = *(undefined8 *)((long)&(pAVar5->str_val).str + 8);
        HistogramStringFunctor::HistogramFinalize<duckdb::string_t>
                  (*(HistogramStringFunctor **)&(pAVar5->str_val).str.value,value,result_00,
                   offset_00);
        result_00 = (Vector *)&result_00->field_0x1;
        uVar8 = uVar8 + 1;
      }
      plVar1[1] = (long)result_00 - *plVar1;
    }
  }
  ListVector::SetListSize(result,(idx_t)result_00);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void ApproxTopKFinalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<ApproxTopKState *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = states[sdata.sel->get_index(i)]->GetState();
		if (state.values.empty()) {
			continue;
		}
		// get up to k values for each state
		// this can be less of fewer unique values were found
		new_entries += MinValue<idx_t>(state.values.size(), state.k);
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto &child_data = ListVector::GetEntry(result);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = states[sdata.sel->get_index(i)]->GetState();
		if (state.values.empty()) {
			mask.SetInvalid(rid);
			continue;
		}
		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t val_idx = 0; val_idx < MinValue<idx_t>(state.values.size(), state.k); val_idx++) {
			auto &val = state.values[val_idx].get();
			D_ASSERT(val.count > 0);
			OP::template HistogramFinalize<string_t>(val.str_val.str, child_data, current_offset);
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}